

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O1

void __thiscall
QArrayDataPointer<short>::relocate(QArrayDataPointer<short> *this,qsizetype offset,short **data)

{
  short *d_first;
  short *psVar1;
  
  d_first = this->ptr + offset;
  QtPrivate::q_relocate_overlap_n<short,long_long>(this->ptr,this->size,d_first);
  if (data != (short **)0x0) {
    psVar1 = *data;
    if ((this->ptr <= psVar1) && (psVar1 < this->ptr + this->size)) {
      *data = psVar1 + offset;
    }
  }
  this->ptr = d_first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }